

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client_async.cpp
# Opt level: O0

void __thiscall Client::DoWrite(Client *this)

{
  Client *local_58;
  code *local_50;
  undefined8 local_48;
  type local_40;
  mutable_buffer local_28;
  size_t local_18;
  size_t len;
  Client *this_local;
  
  local_18 = 0;
  len = (size_t)this;
  do {
    std::operator<<((ostream *)&std::cout,"Enter message: ");
    std::istream::getline((char *)&std::cin,(long)this->cin_buf_);
    local_18 = strlen(this->cin_buf_);
  } while (local_18 == 0);
  local_28 = boost::asio::buffer<char,1024ul>(&this->cin_buf_,local_18);
  local_50 = OnWrite;
  local_48 = 0;
  local_58 = this;
  std::
  bind<void(Client::*)(boost::system::error_code,unsigned_long),Client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_40,(offset_in_Client_to_subr *)&local_50,&local_58,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  boost::asio::
  async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer,std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,unsigned_long)>>
            (&this->socket_,&local_28,&local_40,(type *)0x0);
  return;
}

Assistant:

void Client::DoWrite() {
  std::size_t len = 0;
  do {
    std::cout << "Enter message: ";
    std::cin.getline(cin_buf_, BUF_SIZE);
    len = strlen(cin_buf_);
  } while (len == 0);

  // TODO: Second parameter
  // WriteHandler: void (boost::system::error_code, std::size_t)
  boost::asio::async_write(socket_,
                           boost::asio::buffer(cin_buf_, len),
                           std::bind(&Client::OnWrite, this,
                                     std::placeholders::_1,
                                     std::placeholders::_2));
}